

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pltcalc.cpp
# Opt level: O0

void pltcalc::
     read_input<pltcalc::outrec,std::map<int,std::vector<period_occ,std::allocator<period_occ>>,std::less<int>,std::allocator<std::pair<int_const,std::vector<period_occ,std::allocator<period_occ>>>>>,std::vector<period_occ,std::allocator<period_occ>>>
               (_func_void_outrec_ptr_int_FILE_ptr *OutputData,FILE *outFile,FILE **fout,
               map<int,_std::vector<period_occ,_std::allocator<period_occ>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<period_occ,_std::allocator<period_occ>_>_>_>_>
               *m_occ,vector<period_occ,_std::allocator<period_occ>_> *vp)

{
  sampleslevelRec local_90;
  sampleslevelRec sr;
  OASIS_FLOAT impacted_exposure;
  OASIS_FLOAT local_74;
  float local_70;
  OASIS_FLOAT max_loss;
  OASIS_FLOAT chance_of_loss;
  OASIS_FLOAT mean_impacted_exposure;
  OASIS_FLOAT max_impacted_exposure;
  summarySampleslevelHeader sh;
  vector<sampleslevelRec,_std::allocator<sampleslevelRec>_> vrec;
  size_t i;
  vector<period_occ,_std::allocator<period_occ>_> *pvStack_30;
  int summary_set;
  vector<period_occ,_std::allocator<period_occ>_> *vp_local;
  map<int,_std::vector<period_occ,_std::allocator<period_occ>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<period_occ,_std::allocator<period_occ>_>_>_>_>
  *m_occ_local;
  FILE **fout_local;
  FILE *outFile_local;
  _func_void_outrec_ptr_int_FILE_ptr *OutputData_local;
  
  i._4_4_ = 0;
  pvStack_30 = vp;
  vp_local = (vector<period_occ,_std::allocator<period_occ>_> *)m_occ;
  m_occ_local = (map<int,_std::vector<period_occ,_std::allocator<period_occ>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<period_occ,_std::allocator<period_occ>_>_>_>_>
                 *)fout;
  fout_local = (FILE **)outFile;
  outFile_local = (FILE *)OutputData;
  vrec.super__Vector_base<sampleslevelRec,_std::allocator<sampleslevelRec>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)fread((void *)((long)&i + 4),4,1,_stdin);
  std::vector<sampleslevelRec,_std::allocator<sampleslevelRec>_>::vector
            ((vector<sampleslevelRec,_std::allocator<sampleslevelRec>_> *)&sh.summary_id);
  do {
    if (vrec.super__Vector_base<sampleslevelRec,_std::allocator<sampleslevelRec>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage == (pointer)0x0) {
      std::vector<sampleslevelRec,_std::allocator<sampleslevelRec>_>::~vector
                ((vector<sampleslevelRec,_std::allocator<sampleslevelRec>_> *)&sh.summary_id);
      return;
    }
    chance_of_loss = 0.0;
    max_loss = 0.0;
    local_70 = 0.0;
    local_74 = 0.0;
    vrec.super__Vector_base<sampleslevelRec,_std::allocator<sampleslevelRec>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)fread(&mean_impacted_exposure,0xc,1,_stdin)
    ;
    while (vrec.super__Vector_base<sampleslevelRec,_std::allocator<sampleslevelRec>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
      sr.sidx = 0;
      vrec.super__Vector_base<sampleslevelRec,_std::allocator<sampleslevelRec>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)fread(&local_90,8,1,_stdin);
      if (local_90.sidx != -4) {
        if ((vrec.super__Vector_base<sampleslevelRec,_std::allocator<sampleslevelRec>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage == (pointer)0x0) || (local_90.sidx == 0)) {
          dopltcalc<pltcalc::outrec,std::map<int,std::vector<period_occ,std::allocator<period_occ>>,std::less<int>,std::allocator<std::pair<int_const,std::vector<period_occ,std::allocator<period_occ>>>>>,period_occ>
                    ((summarySampleslevelHeader *)&mean_impacted_exposure,
                     (vector<sampleslevelRec,_std::allocator<sampleslevelRec>_> *)&sh.summary_id,
                     (_func_void_outrec_ptr_int_FILE_ptr *)outFile_local,(FILE *)fout_local,
                     (map<int,_std::vector<period_occ,_std::allocator<period_occ>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<period_occ,_std::allocator<period_occ>_>_>_>_>
                      *)vp_local,pvStack_30,chance_of_loss,max_loss,local_70,local_74);
          outputrows_qplt<std::map<int,std::vector<period_occ,std::allocator<period_occ>>,std::less<int>,std::allocator<std::pair<int_const,std::vector<period_occ,std::allocator<period_occ>>>>>,period_occ>
                    ((summarySampleslevelHeader *)&mean_impacted_exposure,
                     (vector<sampleslevelRec,_std::allocator<sampleslevelRec>_> *)&sh.summary_id,
                     (FILE *)(m_occ_local->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent,
                     (map<int,_std::vector<period_occ,_std::allocator<period_occ>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<period_occ,_std::allocator<period_occ>_>_>_>_>
                      *)vp_local,pvStack_30);
          std::vector<sampleslevelRec,_std::allocator<sampleslevelRec>_>::clear
                    ((vector<sampleslevelRec,_std::allocator<sampleslevelRec>_> *)&sh.summary_id);
          break;
        }
        if (-2 < local_90.sidx) {
          sr.sidx = (int)((float)sh.event_id * (float)(-(uint)(0.0 < local_90.loss) & 0x3f800000));
          outputrows_splt<std::map<int,std::vector<period_occ,std::allocator<period_occ>>,std::less<int>,std::allocator<std::pair<int_const,std::vector<period_occ,std::allocator<period_occ>>>>>,period_occ>
                    ((summarySampleslevelHeader *)&mean_impacted_exposure,&local_90,
                     *(FILE **)&(m_occ_local->_M_t)._M_impl.super__Rb_tree_header._M_header,
                     (map<int,_std::vector<period_occ,_std::allocator<period_occ>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<period_occ,_std::allocator<period_occ>_>_>_>_>
                      *)vp_local,pvStack_30,(OASIS_FLOAT)sr.sidx);
        }
        if (local_90.sidx == -5) {
          local_74 = local_90.loss;
        }
        else if (local_90.sidx == -1) {
          domeanout<pltcalc::outrec,std::map<int,std::vector<period_occ,std::allocator<period_occ>>,std::less<int>,std::allocator<std::pair<int_const,std::vector<period_occ,std::allocator<period_occ>>>>>,period_occ>
                    ((summarySampleslevelHeader *)&mean_impacted_exposure,local_90.loss,
                     (_func_void_outrec_ptr_int_FILE_ptr *)outFile_local,(FILE *)fout_local,
                     (map<int,_std::vector<period_occ,_std::allocator<period_occ>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<period_occ,_std::allocator<period_occ>_>_>_>_>
                      *)vp_local,pvStack_30,0.0,local_74);
        }
        else {
          std::vector<sampleslevelRec,_std::allocator<sampleslevelRec>_>::push_back
                    ((vector<sampleslevelRec,_std::allocator<sampleslevelRec>_> *)&sh.summary_id,
                     &local_90);
          max_loss = (float)sr.sidx / (float)samplesize_ + max_loss;
          if (chance_of_loss < (float)sr.sidx) {
            chance_of_loss = (OASIS_FLOAT)sr.sidx;
          }
          local_70 = (float)(0.0 < local_90.loss) / (float)samplesize_ + local_70;
        }
      }
    }
  } while( true );
}

Assistant:

inline void read_input(void (*OutputData)(const T&, const int, FILE*),
			       FILE * outFile, FILE ** fout,
			       moccT &m_occ, periodT &vp)
	{
		int summary_set = 0;
		size_t i = fread(&summary_set, sizeof(summary_set), 1, stdin);
		std::vector<sampleslevelRec> vrec;
		summarySampleslevelHeader sh;
		while (i != 0) {
			OASIS_FLOAT max_impacted_exposure = 0;
			OASIS_FLOAT mean_impacted_exposure = 0;
			OASIS_FLOAT chance_of_loss = 0;
			OASIS_FLOAT max_loss = 0;
			i = fread(&sh, sizeof(sh), 1, stdin);
			while (i != 0) {
				OASIS_FLOAT impacted_exposure = 0;
				sampleslevelRec sr;
				i = fread(&sr, sizeof(sr), 1, stdin);
				if (sr.sidx == number_of_affected_risk_idx) continue;
				if (i == 0 || sr.sidx == 0) {
					dopltcalc(sh, vrec, OutputData, outFile,
						  m_occ, vp,
						  max_impacted_exposure,
						  mean_impacted_exposure,
						  chance_of_loss, max_loss);
					outputrows_qplt(sh, vrec, fout[QPLT],
							m_occ, vp);
					vrec.clear();
					break;
				} else if (sr.sidx >= -1) {
					impacted_exposure = sh.expval * (sr.loss > 0);
					outputrows_splt(sh, sr, fout[SPLT],
							m_occ, vp,
							impacted_exposure);
				}

				if (sr.sidx == max_loss_idx) {
					max_loss = sr.loss;
				} else if (sr.sidx == mean_idx) {
					domeanout(sh, sr.loss, OutputData,
						  outFile, m_occ, vp, 0.0,
						  max_loss);
				} else {
					vrec.push_back(sr);
					mean_impacted_exposure += impacted_exposure / samplesize_;
					if (impacted_exposure > max_impacted_exposure) {
						max_impacted_exposure = impacted_exposure;
					}
					chance_of_loss += (sr.loss > 0) / (OASIS_FLOAT)samplesize_;   // Relative frequency
				}
			}
		}
	}